

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

char * JS_AtomGetStrRT(JSRuntime *rt,char *buf,int buf_size,JSAtom atom)

{
  JSAtomStruct *pJVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  uint c;
  uint8_t *buf_00;
  
  if (buf_size < 0) {
    snprintf(buf,0x40,"%u",(ulong)(buf_size & 0x7fffffff));
    return buf;
  }
  if (buf_size == 0) {
    builtin_strncpy(buf,"<null>",7);
    return buf;
  }
  pJVar1 = rt->atom_array[(uint)buf_size];
  buf_00 = (uint8_t *)buf;
  if (pJVar1 != (JSAtomStruct *)0x0) {
    uVar3 = *(ulong *)&pJVar1->field_0x4;
    if (-1 < (int)(uint)uVar3) {
      if ((uVar3 & 0x7fffffff) == 0) {
LAB_0011b8ee:
        return (char *)(pJVar1 + 1);
      }
      uVar4 = 0;
      bVar5 = 0;
      do {
        bVar5 = bVar5 | *(byte *)((long)&pJVar1[1].header.ref_count + uVar4);
        uVar4 = uVar4 + 1;
      } while (((uint)uVar3 & 0x7fffffff) != uVar4);
      if (bVar5 < 0x80) goto LAB_0011b8ee;
    }
    if ((uVar3 & 0x7fffffff) != 0) {
      uVar4 = 0;
      do {
        if ((int)uVar3 < 0) {
          c = (uint)*(ushort *)((long)&pJVar1[1].header.ref_count + uVar4 * 2);
        }
        else {
          c = (uint)*(byte *)((long)&pJVar1[1].header.ref_count + uVar4);
        }
        if (0x39 < (long)buf_00 - (long)buf) break;
        if (c < 0x80) {
          *buf_00 = (uint8_t)c;
          buf_00 = buf_00 + 1;
        }
        else {
          iVar2 = unicode_to_utf8(buf_00,c);
          buf_00 = buf_00 + iVar2;
        }
        uVar4 = uVar4 + 1;
        uVar3 = *(ulong *)&pJVar1->field_0x4;
      } while (uVar4 < ((uint)uVar3 & 0x7fffffff));
    }
  }
  *buf_00 = '\0';
  return buf;
}

Assistant:

static const char *JS_AtomGetStrRT(JSRuntime *rt, char *buf, int buf_size,
                                   JSAtom atom)
{
    if (__JS_AtomIsTaggedInt(atom)) {
        snprintf(buf, buf_size, "%u", __JS_AtomToUInt32(atom));
    } else {
        JSAtomStruct *p;
        assert(atom < rt->atom_size);
        if (atom == JS_ATOM_NULL) {
            snprintf(buf, buf_size, "<null>");
        } else {
            int i, c;
            char *q;
            JSString *str;

            q = buf;
            p = rt->atom_array[atom];
            assert(!atom_is_free(p));
            str = p;
            if (str) {
                if (!str->is_wide_char) {
                    /* special case ASCII strings */
                    c = 0;
                    for(i = 0; i < str->len; i++) {
                        c |= str->u.str8[i];
                    }
                    if (c < 0x80)
                        return (const char *)str->u.str8;
                }
                for(i = 0; i < str->len; i++) {
                    if (str->is_wide_char)
                        c = str->u.str16[i];
                    else
                        c = str->u.str8[i];
                    if ((q - buf) >= buf_size - UTF8_CHAR_LEN_MAX)
                        break;
                    if (c < 128) {
                        *q++ = c;
                    } else {
                        q += unicode_to_utf8((uint8_t *)q, c);
                    }
                }
            }
            *q = '\0';
        }
    }
    return buf;
}